

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void mouse_callback(GLFWwindow *window,double xpos,double ypos)

{
  double dVar1;
  double dVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  if (firstMouse) {
    firstMouse = false;
    lastX = (float)xpos;
    lastY = (float)ypos;
  }
  yaw = (float)(xpos - (double)lastX) * 0.5 + yaw;
  fVar5 = (float)((double)lastY - ypos) * 0.5 + pitch;
  fVar3 = 89.0;
  if (fVar5 <= 89.0) {
    fVar3 = fVar5;
  }
  pitch = -89.0;
  if (-89.0 <= fVar3) {
    pitch = fVar3;
  }
  lastX = (float)xpos;
  lastY = (float)ypos;
  dVar1 = cos((double)(yaw * 0.017453292));
  dVar2 = cos((double)(pitch * 0.017453292));
  fVar3 = (float)(dVar2 * dVar1);
  dVar1 = sin((double)(pitch * 0.017453292));
  fVar5 = (float)dVar1;
  dVar1 = sin((double)(yaw * 0.017453292));
  dVar2 = cos((double)(pitch * 0.017453292));
  fVar6 = (float)(dVar2 * dVar1);
  fVar4 = fVar6 * fVar6 + fVar5 * fVar5 + fVar3 * fVar3;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar4 = 1.0 / fVar4;
  cameraFront.field_0.x = fVar3 * fVar4;
  cameraFront.field_1.y = fVar5 * fVar4;
  cameraFront.field_2.z = fVar4 * fVar6;
  return;
}

Assistant:

static void mouse_callback(GLFWwindow* window, double xpos, double ypos){
    if(firstMouse){
        lastX = xpos;
        lastY = ypos;
        firstMouse = false;
    }
    float xOffset = xpos - lastX;
    float yOffset = lastY - ypos;//注意这个
    lastX = xpos;
    lastY = ypos;
    float sensitivity = 0.5;
    xOffset *= sensitivity;
    yOffset *= sensitivity;
    yaw   += xOffset;
    pitch += yOffset;
    if(pitch > 89.0f)
        pitch = 89.0f;
    if(pitch < -89.0f)
        pitch = -89.0f;
    glm::vec3 front;
    front.x = cos(glm::radians(yaw)) * cos(glm::radians(pitch));
    front.y = sin(glm::radians(pitch));
    front.z = sin(glm::radians(yaw)) * cos(glm::radians(pitch));
    cameraFront = glm::normalize(front);
}